

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O2

void QGraphicsSceneBspTreeIndexPrivate::sortItems
               (QList<QGraphicsItem_*> *itemList,SortOrder order,bool sortCacheEnabled,
               bool onlyTopLevelItems)

{
  iterator __first;
  iterator __last;
  code *__comp;
  
  if (order == ~AscendingOrder) {
    return;
  }
  if (onlyTopLevelItems) {
    if (order == DescendingOrder) {
      __comp = qt_closestLeaf;
    }
    else {
      if (order != AscendingOrder) {
        return;
      }
      __comp = qt_notclosestLeaf;
    }
  }
  else if (sortCacheEnabled) {
    if (order == DescendingOrder) {
      __comp = closestItemFirst_withCache;
    }
    else {
      if (order != AscendingOrder) {
        return;
      }
      __comp = closestItemLast_withCache;
    }
  }
  else if (order == DescendingOrder) {
    __comp = qt_closestItemFirst;
  }
  else {
    if (order != AscendingOrder) {
      return;
    }
    __comp = qt_closestItemLast;
  }
  __first = QList<QGraphicsItem_*>::begin(itemList);
  __last = QList<QGraphicsItem_*>::end(itemList);
  std::
  __sort<QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
            (__first,__last,
             (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)__comp);
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::sortItems(QList<QGraphicsItem *> *itemList, Qt::SortOrder order,
                                                  bool sortCacheEnabled, bool onlyTopLevelItems)
{
    if (order == Qt::SortOrder(-1))
        return;

    if (onlyTopLevelItems) {
        if (order == Qt::DescendingOrder)
            std::sort(itemList->begin(), itemList->end(), qt_closestLeaf);
        else if (order == Qt::AscendingOrder)
            std::sort(itemList->begin(), itemList->end(), qt_notclosestLeaf);
        return;
    }

    if (sortCacheEnabled) {
        if (order == Qt::DescendingOrder) {
            std::sort(itemList->begin(), itemList->end(), closestItemFirst_withCache);
        } else if (order == Qt::AscendingOrder) {
            std::sort(itemList->begin(), itemList->end(), closestItemLast_withCache);
        }
    } else {
        if (order == Qt::DescendingOrder) {
            std::sort(itemList->begin(), itemList->end(), qt_closestItemFirst);
        } else if (order == Qt::AscendingOrder) {
            std::sort(itemList->begin(), itemList->end(), qt_closestItemLast);
        }
    }
}